

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLSLangUtils.cpp
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> *
Diligent::GLSLangUtils::HLSLtoSPIRV
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          ShaderCreateInfo *ShaderCI,SpirvVersion Version,char *ExtraDefinitions,
          IDataBlob **ppCompilerOutput)

{
  EShLanguage s;
  spv_target_env TargetEnv;
  char (*Args_1) [55];
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *SrcSPIRV;
  EProfile shProfile;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_1e8;
  string Preamble;
  ShaderSourceFileData SourceData;
  int ShaderStringLengths [1];
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_180;
  IncluderImpl Includer;
  char *Names [1];
  char *ShaderStrings [1];
  TShader Shader;
  
  s = anon_unknown_3::ShaderTypeToShLanguage((ShaderCI->Desc).ShaderType);
  glslang::TShader::TShader(&Shader,s);
  shProfile = ENoProfile;
  Args_1 = (char (*) [55])(ulong)Version;
  anon_unknown_3::SetupWithSpirvVersion(&Shader,&shProfile,s,Version,EShSourceHlsl);
  if (ShaderCI->SourceLanguage != SHADER_SOURCE_LANGUAGE_HLSL) {
    FormatString<char[26],char[55]>
              ((string *)&Includer,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"ShaderCI.SourceLanguage == SHADER_SOURCE_LANGUAGE_HLSL",Args_1);
    DebugAssertionFailed
              ((Char *)Includer.super_Includer._vptr_Includer,"HLSLtoSPIRV",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/GLSLangUtils.cpp"
               ,0x1b9);
    std::__cxx11::string::~string((string *)&Includer);
  }
  if (s - EShLangTask < 0xfffffffa) {
    if (s - EShLangCount < 0xfffffffe) goto LAB_0028b139;
    FormatString<char[72]>
              ((string *)&Includer,
               (char (*) [72])
               "Mesh shaders are not supported, use DXCompiler to build SPIRV from HLSL");
    DebugAssertionFailed
              ((Char *)Includer.super_Includer._vptr_Includer,"HLSLtoSPIRV",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/GLSLangUtils.cpp"
               ,0x1be);
  }
  else {
    FormatString<char[79]>
              ((string *)&Includer,
               (char (*) [79])
               "Ray tracing shaders are not supported, use DXCompiler to build SPIRV from HLSL");
    DebugAssertionFailed
              ((Char *)Includer.super_Includer._vptr_Includer,"HLSLtoSPIRV",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/GLSLangUtils.cpp"
               ,0x1bc);
  }
  std::__cxx11::string::~string((string *)&Includer);
LAB_0028b139:
  glslang::TShader::setHlslIoMapping(&Shader,true);
  glslang::TShader::setEntryPoint(&Shader,ShaderCI->EntryPoint);
  Shader.environment.target.hlslFunctionality1 = true;
  ReadShaderSourceFile(&SourceData,ShaderCI);
  Preamble._M_dataplus._M_p = (pointer)&Preamble.field_2;
  Preamble._M_string_length = 0;
  Preamble.field_2._M_local_buf[0] = '\0';
  if ((ShaderCI->CompileFlags & SHADER_COMPILE_FLAG_PACK_MATRIX_ROW_MAJOR) !=
      SHADER_COMPILE_FLAG_NONE) {
    std::__cxx11::string::append((char *)&Preamble);
  }
  std::__cxx11::string::append((char *)&Preamble);
  std::__cxx11::string::append((char *)&Preamble);
  AppendShaderTypeDefinitions(&Preamble,(ShaderCI->Desc).ShaderType);
  if (ExtraDefinitions != (char *)0x0) {
    std::__cxx11::string::append((char *)&Preamble);
  }
  if (((ShaderCI->Macros).Elements != (ShaderMacro *)0x0) && ((ShaderCI->Macros).Count != 0)) {
    std::__cxx11::string::push_back((char)&Preamble);
    AppendShaderMacros(&Preamble,&ShaderCI->Macros);
  }
  Shader.preamble = Preamble._M_dataplus._M_p;
  ShaderStrings[0] = SourceData.Source;
  ShaderStringLengths[0] = SourceData.SourceLength;
  Names[0] = "";
  if (ShaderCI->FilePath != (char *)0x0) {
    Names[0] = ShaderCI->FilePath;
  }
  glslang::TShader::setStringsWithLengthsAndNames(&Shader,ShaderStrings,ShaderStringLengths,Names,1)
  ;
  glslang::TShader::setDxPositionW(&Shader,true);
  Includer.m_pInputStreamFactory = ShaderCI->pShaderSourceStreamFactory;
  Includer.m_IncludeRes._M_h._M_buckets = &Includer.m_IncludeRes._M_h._M_single_bucket;
  Includer.super_Includer._vptr_Includer = (_func_int **)&PTR_includeSystem_00899120;
  Includer.m_IncludeRes._M_h._M_bucket_count = 1;
  Includer.m_IncludeRes._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  Includer.m_IncludeRes._M_h._M_element_count = 0;
  Includer.m_IncludeRes._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  Includer.m_IncludeRes._M_h._M_rehash_policy._M_next_resize = 0;
  Includer.m_IncludeRes._M_h._M_single_bucket = (__node_base_ptr)0x0;
  Includer.m_DataBlobs._M_h._M_buckets = &Includer.m_DataBlobs._M_h._M_single_bucket;
  Includer.m_DataBlobs._M_h._M_bucket_count = 1;
  Includer.m_DataBlobs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  Includer.m_DataBlobs._M_h._M_element_count = 0;
  Includer.m_DataBlobs._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  Includer.m_DataBlobs._M_h._M_rehash_policy._M_next_resize = 0;
  Includer.m_DataBlobs._M_h._M_single_bucket = (__node_base_ptr)0x0;
  anon_unknown_3::CompileShaderInternal
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1e8,&Shader,
             EShMsgHlslLegalization|EShMsgReadHlsl|EShMsgVulkanRules|EShMsgSpvRules,
             &Includer.super_Includer,SourceData.Source,(ulong)SourceData.SourceLength,true,
             shProfile,ppCompilerOutput);
  if (local_1e8._M_impl.super__Vector_impl_data._M_start ==
      local_1e8._M_impl.super__Vector_impl_data._M_finish) {
    (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
    _M_impl.super__Vector_impl_data._M_start = local_1e8._M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
    _M_impl.super__Vector_impl_data._M_finish = local_1e8._M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_1e8._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_1e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1e8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1e8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    TargetEnv = anon_unknown_3::SpirvVersionToSpvTargetEnv(Version);
    SrcSPIRV = &local_1e8;
    OptimizeSPIRV((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_180,
                  (vector<unsigned_int,_std::allocator<unsigned_int>_> *)SrcSPIRV,TargetEnv,
                  SPIRV_OPTIMIZATION_FLAG_PERFORMANCE|SPIRV_OPTIMIZATION_FLAG_LEGALIZATION);
    if (local_180._M_impl.super__Vector_impl_data._M_start ==
        local_180._M_impl.super__Vector_impl_data._M_finish) {
      LogError<false,char[101]>
                (false,"HLSLtoSPIRV",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/GLSLangUtils.cpp"
                 ,0x1f1,(char (*) [101])
                        "Failed to legalize SPIR-V shader generated by HLSL front-end. This may result in undefined behavior."
                );
      (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_start = local_1e8._M_impl.super__Vector_impl_data._M_start;
      (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_finish =
           local_1e8._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_start = local_180._M_impl.super__Vector_impl_data._M_start;
      (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_finish =
           local_180._M_impl.super__Vector_impl_data._M_finish;
      SrcSPIRV = &local_180;
    }
    (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&SrcSPIRV->_M_impl)->_M_impl
         ).super__Vector_impl_data._M_end_of_storage;
    (((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&SrcSPIRV->_M_impl)->_M_impl).
    super__Vector_impl_data._M_start = (pointer)0x0;
    (((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&SrcSPIRV->_M_impl)->_M_impl).
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&SrcSPIRV->_M_impl)->_M_impl).
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_180);
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_1e8);
  anon_unknown_3::IncluderImpl::~IncluderImpl(&Includer);
  std::__cxx11::string::~string((string *)&Preamble);
  RefCntAutoPtr<Diligent::IDataBlob>::Release(&SourceData.pFileData);
  glslang::TShader::~TShader(&Shader);
  return __return_storage_ptr__;
}

Assistant:

std::vector<unsigned int> HLSLtoSPIRV(const ShaderCreateInfo& ShaderCI,
                                      SpirvVersion            Version,
                                      const char*             ExtraDefinitions,
                                      IDataBlob**             ppCompilerOutput)
{
    EShLanguage        ShLang = ShaderTypeToShLanguage(ShaderCI.Desc.ShaderType);
    ::glslang::TShader Shader{ShLang};
    EShMessages        messages  = (EShMessages)(EShMsgSpvRules | EShMsgVulkanRules | EShMsgReadHlsl | EShMsgHlslLegalization);
    ::EProfile         shProfile = EProfile::ENoProfile;

    SetupWithSpirvVersion(Shader, shProfile, ShLang, Version, ::glslang::EShSourceHlsl);

    VERIFY_EXPR(ShaderCI.SourceLanguage == SHADER_SOURCE_LANGUAGE_HLSL);

    VERIFY(ShLang != EShLangRayGen && ShLang != EShLangIntersect && ShLang != EShLangAnyHit && ShLang != EShLangClosestHit && ShLang != EShLangMiss && ShLang != EShLangCallable,
           "Ray tracing shaders are not supported, use DXCompiler to build SPIRV from HLSL");
    VERIFY(ShLang != EShLangTaskNV && ShLang != EShLangMeshNV,
           "Mesh shaders are not supported, use DXCompiler to build SPIRV from HLSL");

    Shader.setHlslIoMapping(true);
    Shader.setEntryPoint(ShaderCI.EntryPoint);
    Shader.setEnvTargetHlslFunctionality1();

    const auto SourceData = ReadShaderSourceFile(ShaderCI);

    std::string Preamble;
    if ((ShaderCI.CompileFlags & SHADER_COMPILE_FLAG_PACK_MATRIX_ROW_MAJOR) != 0)
        Preamble += "#pragma pack_matrix(row_major)\n\n";
    Preamble.append("#define GLSLANG\n\n");
    Preamble.append(g_HLSLDefinitions);
    AppendShaderTypeDefinitions(Preamble, ShaderCI.Desc.ShaderType);

    if (ExtraDefinitions != nullptr)
        Preamble += ExtraDefinitions;

    if (ShaderCI.Macros)
    {
        Preamble += '\n';
        AppendShaderMacros(Preamble, ShaderCI.Macros);
    }

    Shader.setPreamble(Preamble.c_str());

    const char* ShaderStrings[]       = {SourceData.Source};
    const int   ShaderStringLengths[] = {static_cast<int>(SourceData.SourceLength)};
    const char* Names[]               = {ShaderCI.FilePath != nullptr ? ShaderCI.FilePath : ""};
    Shader.setStringsWithLengthsAndNames(ShaderStrings, ShaderStringLengths, Names, 1);

    // By default, PSInput.SV_Position.w == 1 / VSOutput.SV_Position.w.
    // Make the behavior consistent with DX:
    Shader.setDxPositionW(true);

    IncluderImpl Includer{ShaderCI.pShaderSourceStreamFactory};

    auto SPIRV = CompileShaderInternal(Shader, messages, &Includer, SourceData.Source, SourceData.SourceLength, true, shProfile, ppCompilerOutput);
    if (SPIRV.empty())
        return SPIRV;

#ifdef USE_SPIRV_TOOLS
    // SPIR-V bytecode generated from HLSL must be legalized to
    // turn it into a valid vulkan SPIR-V shader.
    auto LegalizedSPIRV = OptimizeSPIRV(SPIRV, SpirvVersionToSpvTargetEnv(Version), SPIRV_OPTIMIZATION_FLAG_LEGALIZATION | SPIRV_OPTIMIZATION_FLAG_PERFORMANCE);
    if (!LegalizedSPIRV.empty())
    {
        return LegalizedSPIRV;
    }
    else
    {
        LOG_ERROR("Failed to legalize SPIR-V shader generated by HLSL front-end. This may result in undefined behavior.");
    }
#endif
    return SPIRV;
}